

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O0

void print_data_test_case<char_const*,long,char_const*,int>
               (string *expected_output,char *args,long args_1,char *args_2,int args_3)

{
  __type _Var1;
  pointer stream;
  char *pcVar2;
  size_type sVar3;
  allocator<char> local_151;
  string local_150;
  string local_130;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  string output_data;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  int args_local_3;
  char *args_local_2;
  long args_local_1;
  char *args_local;
  string *expected_output_local;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl._4_4_ = args_3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"StringsTest-data",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"w",&local_99);
  phosg::fopen_unique((phosg *)local_40,&local_60,&local_98,(FILE *)0x0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  stream = std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                     ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,args,(allocator<char> *)(output_data.field_2._M_local_buf + 0xf));
  phosg::print_data(stream,&local_c0,args_1,args_2,
                    (long)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                          super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._4_4_);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(output_data.field_2._M_local_buf + 0xf));
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"StringsTest-data",&local_109);
  phosg::load_file((string *)local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  _Var1 = std::operator==(expected_output,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    fputs("(print_data) Expected:\n",_stderr);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (expected_output);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (expected_output);
    fwrite(pcVar2,1,sVar3,_stderr);
    fputs("(print_data) Actual:\n",_stderr);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e8);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
    fwrite(pcVar2,1,sVar3,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x1d);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,args,&local_151);
  phosg::format_data(&local_130,&local_150,args_1,args_2,
                     (long)f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                           super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                           super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl._4_4_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
             &local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  _Var1 = std::operator==(expected_output,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    fputs("(format_data) Expected:\n",_stderr);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (expected_output);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (expected_output);
    fwrite(pcVar2,1,sVar3,_stderr);
    fputs("(format_data) Actual:\n",_stderr);
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e8);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
    fwrite(pcVar2,1,sVar3,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x27);
  }
  std::__cxx11::string::~string((string *)local_e8);
  return;
}

Assistant:

void print_data_test_case(const string& expected_output, ArgTs... args) {

  // macOS doesn't have fmemopen, so we just write to a file because I'm too
  // lazy to use funopen()
  {
    auto f = fopen_unique("StringsTest-data", "w");
    print_data(f.get(), args...);
  }
  string output_data = load_file("StringsTest-data");

  if (expected_output != output_data) {
    fputs("(print_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(print_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }

  // Also test format_data - it should produce the same result
  output_data = format_data(args...);
  if (expected_output != output_data) {
    fputs("(format_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(format_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }
}